

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O1

void __thiscall OpenMD::NPrT::evolveEtaA(NPrT *this)

{
  double dVar1;
  double dVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  uint j;
  long lVar5;
  ulong uVar6;
  Mat3x3d *pMVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Mat3x3d hmat;
  Mat3x3d local_50;
  
  Snapshot::getHmat(&local_50,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap
                   );
  uVar3 = (ulong)this->axis_;
  uVar8 = (ulong)this->axis1_;
  uVar6 = (ulong)this->axis2_;
  dVar11 = -*(double *)
             ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
             uVar3 * 0x20);
  dVar10 = (this->super_NPT).targetPressure / 163882576.0;
  dVar1 = *(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar6 * 0x20);
  dVar2 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar9 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           uVar8 * 0x20) *
          *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           uVar6 * 0x20) * dVar2;
  dVar12 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar8 * 0x20) =
       *(double *)
        ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        uVar8 * 0x20) -
       (((*(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar8 * 0x20) - dVar10) * dVar11 -
        this->surfaceTension_) * dVar9) / dVar12;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar6 * 0x20) =
       *(double *)
        ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        uVar6 * 0x20) - (((dVar1 - dVar10) * dVar11 - this->surfaceTension_) * dVar9) / dVar12;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar3 * 0x20) =
       ((*(double *)
          ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                 super_RectMatrix<double,_3U,_3U>.data_ + uVar3 * 0x20) - dVar10) *
       dVar2 * (this->super_NPT).instaVol) / dVar12 +
       *(double *)
        ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        uVar3 * 0x20);
  pMVar7 = &this->oldEta_;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      (pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar5] =
           pMVar7[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar5]
      ;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    pMVar7 = (Mat3x3d *)
             ((pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar4 != 3);
  return;
}

Assistant:

void NPrT::evolveEtaA() {
    Mat3x3d hmat = snap->getHmat();
    RealType hz  = hmat(axis_, axis_);
    RealType Axy = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);
    RealType sx  = -hz * (press(axis1_, axis1_) -
                         targetPressure / Constants::pressureConvert);
    RealType sy  = -hz * (press(axis2_, axis2_) -
                         targetPressure / Constants::pressureConvert);
    eta(axis1_, axis1_) -= dt2 * Axy * (sx - surfaceTension_) / (NkBT * tb2);
    eta(axis2_, axis2_) -= dt2 * Axy * (sy - surfaceTension_) / (NkBT * tb2);
    eta(axis_, axis_) +=
        dt2 * instaVol *
        (press(axis_, axis_) - targetPressure / Constants::pressureConvert) /
        (NkBT * tb2);
    oldEta_ = eta;
  }